

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void HistogramCombineEntropyBin
               (VP8LHistogramSet *image_histo,int *num_used,uint32_t *clusters,
               uint16_t *cluster_mappings,VP8LHistogram *cur_combo,uint16_t *bin_map,int num_bins,
               int32_t combine_cost_factor,int low_effort)

{
  VP8LHistogram **ppVVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int64_t iVar5;
  long in_RCX;
  long in_RDX;
  int *in_RSI;
  VP8LHistogramSet *in_RDI;
  VP8LHistogram *in_R8;
  long in_R9;
  int in_stack_00000008;
  int max_combine_failures;
  int try_combine;
  int64_t bit_cost_thresh;
  uint64_t bit_cost;
  int first;
  int bin_id;
  anon_struct_4_2_be341b0f bin_info [64];
  int idx;
  VP8LHistogram **histograms;
  undefined6 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe96;
  undefined1 in_stack_fffffffffffffe97;
  undefined4 in_stack_fffffffffffffe98;
  uint in_stack_fffffffffffffe9c;
  VP8LHistogram *in_stack_fffffffffffffea0;
  VP8LHistogram *a;
  ushort auStack_148 [4];
  VP8LHistogram *in_stack_fffffffffffffec0;
  int local_3c;
  VP8LHistogram *local_28;
  long local_20;
  long local_18;
  int *local_10;
  VP8LHistogramSet *local_8;
  
  ppVVar1 = in_RDI->histograms;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_3c = 0; local_3c < in_stack_00000008; local_3c = local_3c + 1) {
    auStack_148[(long)local_3c * 2] = 0xffff;
    auStack_148[(long)local_3c * 2 + 1] = 0;
  }
  for (local_3c = 0; local_3c < *local_10; local_3c = local_3c + 1) {
    *(short *)(local_20 + (long)local_3c * 2) = (short)local_3c;
  }
  for (local_3c = 0; local_3c < local_8->size; local_3c = local_3c + 1) {
    if (ppVVar1[local_3c] != (VP8LHistogram *)0x0) {
      uVar2 = (uint)*(ushort *)(in_R9 + (long)local_3c * 2);
      iVar3 = (int)(short)auStack_148[(long)(int)uVar2 * 2];
      if (iVar3 == -1) {
        auStack_148[(long)(int)uVar2 * 2] = (ushort)local_3c;
      }
      else if ((int)bit_cost_thresh == 0) {
        a = (VP8LHistogram *)ppVVar1[local_3c]->bit_cost_;
        iVar5 = DivRound((long)a * (long)max_combine_failures,100);
        in_stack_fffffffffffffea0 = (VP8LHistogram *)-iVar5;
        iVar4 = HistogramAddEval(a,in_stack_fffffffffffffea0,
                                 (VP8LHistogram *)
                                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                 CONCAT17(in_stack_fffffffffffffe97,
                                          CONCAT16(in_stack_fffffffffffffe96,
                                                   in_stack_fffffffffffffe90)));
        if (iVar4 != 0) {
          in_stack_fffffffffffffe97 = true;
          if ((local_28->trivial_symbol_ == 0xffffffff) &&
             (in_stack_fffffffffffffe96 = false,
             in_stack_fffffffffffffe97 = in_stack_fffffffffffffe96,
             ppVVar1[local_3c]->trivial_symbol_ == 0xffffffff)) {
            in_stack_fffffffffffffe96 = ppVVar1[iVar3]->trivial_symbol_ == 0xffffffff;
            in_stack_fffffffffffffe97 = in_stack_fffffffffffffe96;
          }
          in_stack_fffffffffffffe9c = (uint)(byte)in_stack_fffffffffffffe97;
          in_stack_fffffffffffffe98 = 0x20;
          if ((in_stack_fffffffffffffe9c == 0) && (auStack_148[(long)(int)uVar2 * 2 + 1] < 0x20)) {
            auStack_148[(long)(int)uVar2 * 2 + 1] = auStack_148[(long)(int)uVar2 * 2 + 1] + 1;
          }
          else {
            HistogramSwap(&local_28,ppVVar1 + iVar3);
            HistogramSetRemoveHistogram(local_8,local_3c,local_10);
            *(short *)(local_20 + (ulong)*(uint *)(local_18 + (long)local_3c * 4) * 2) =
                 (short)*(undefined4 *)(local_18 + (long)iVar3 * 4);
          }
        }
      }
      else {
        HistogramAdd(in_stack_fffffffffffffea0,
                     (VP8LHistogram *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                     (VP8LHistogram *)
                     CONCAT17(in_stack_fffffffffffffe97,
                              CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)));
        HistogramSetRemoveHistogram(local_8,local_3c,local_10);
        *(short *)(local_20 + (ulong)*(uint *)(local_18 + (long)local_3c * 4) * 2) =
             (short)*(undefined4 *)(local_18 + (long)iVar3 * 4);
      }
    }
  }
  if ((int)bit_cost_thresh != 0) {
    for (local_3c = 0; local_3c < local_8->size; local_3c = local_3c + 1) {
      if (ppVVar1[local_3c] != (VP8LHistogram *)0x0) {
        UpdateHistogramCost(in_stack_fffffffffffffec0);
      }
    }
  }
  return;
}

Assistant:

static void HistogramCombineEntropyBin(
    VP8LHistogramSet* const image_histo, int* num_used,
    const uint32_t* const clusters, uint16_t* const cluster_mappings,
    VP8LHistogram* cur_combo, const uint16_t* const bin_map, int num_bins,
    int32_t combine_cost_factor, int low_effort) {
  VP8LHistogram** const histograms = image_histo->histograms;
  int idx;
  struct {
    int16_t first;    // position of the histogram that accumulates all
                      // histograms with the same bin_id
    uint16_t num_combine_failures;   // number of combine failures per bin_id
  } bin_info[BIN_SIZE];

  assert(num_bins <= BIN_SIZE);
  for (idx = 0; idx < num_bins; ++idx) {
    bin_info[idx].first = -1;
    bin_info[idx].num_combine_failures = 0;
  }

  // By default, a cluster matches itself.
  for (idx = 0; idx < *num_used; ++idx) cluster_mappings[idx] = idx;
  for (idx = 0; idx < image_histo->size; ++idx) {
    int bin_id, first;
    if (histograms[idx] == NULL) continue;
    bin_id = bin_map[idx];
    first = bin_info[bin_id].first;
    if (first == -1) {
      bin_info[bin_id].first = idx;
    } else if (low_effort) {
      HistogramAdd(histograms[idx], histograms[first], histograms[first]);
      HistogramSetRemoveHistogram(image_histo, idx, num_used);
      cluster_mappings[clusters[idx]] = clusters[first];
    } else {
      // try to merge #idx into #first (both share the same bin_id)
      const uint64_t bit_cost = histograms[idx]->bit_cost_;
      const int64_t bit_cost_thresh =
          -DivRound((int64_t)bit_cost * combine_cost_factor, 100);
      if (HistogramAddEval(histograms[first], histograms[idx], cur_combo,
                           bit_cost_thresh)) {
        // Try to merge two histograms only if the combo is a trivial one or
        // the two candidate histograms are already non-trivial.
        // For some images, 'try_combine' turns out to be false for a lot of
        // histogram pairs. In that case, we fallback to combining
        // histograms as usual to avoid increasing the header size.
        const int try_combine =
            (cur_combo->trivial_symbol_ != VP8L_NON_TRIVIAL_SYM) ||
            ((histograms[idx]->trivial_symbol_ == VP8L_NON_TRIVIAL_SYM) &&
             (histograms[first]->trivial_symbol_ == VP8L_NON_TRIVIAL_SYM));
        const int max_combine_failures = 32;
        if (try_combine ||
            bin_info[bin_id].num_combine_failures >= max_combine_failures) {
          // move the (better) merged histogram to its final slot
          HistogramSwap(&cur_combo, &histograms[first]);
          HistogramSetRemoveHistogram(image_histo, idx, num_used);
          cluster_mappings[clusters[idx]] = clusters[first];
        } else {
          ++bin_info[bin_id].num_combine_failures;
        }
      }
    }
  }
  if (low_effort) {
    // for low_effort case, update the final cost when everything is merged
    for (idx = 0; idx < image_histo->size; ++idx) {
      if (histograms[idx] == NULL) continue;
      UpdateHistogramCost(histograms[idx]);
    }
  }
}